

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sem_impl_fifo.c
# Opt level: O0

fifo_sem_t * fifo_sem_open(char *name,int oflag,...)

{
  __mode_t __mode;
  undefined8 uVar1;
  char in_AL;
  int iVar2;
  int *piVar3;
  fifo_sem_t *__ptr;
  ssize_t sVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  uint local_60;
  int local_5c;
  int flags;
  int save_errno;
  int i;
  char c;
  uint value;
  mode_t mode;
  va_list ap;
  fifo_sem_t *sem;
  int oflag_local;
  char *name_local;
  
  __mode = (__mode_t)local_108;
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_108 = in_RDX;
  uVar1 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  sem._4_4_ = oflag;
  if ((oflag & 0x40U) != 0) {
    ap[0].overflow_arg_area = local_118;
    ap[0]._0_8_ = &stack0x00000008;
    mode = 0x30;
    value = 0x20;
    i = (int)local_100;
    local_100 = in_RCX;
    iVar2 = mkfifo(name,__mode);
    uVar1 = local_100;
    if (iVar2 < 0) {
      piVar3 = __errno_location();
      if ((*piVar3 != 0x11) || ((oflag & 0x80U) != 0)) {
        return (fifo_sem_t *)0xffffffffffffffff;
      }
      sem._4_4_ = 0;
      uVar1 = local_100;
    }
  }
  local_100 = uVar1;
  __ptr = (fifo_sem_t *)malloc(0xc);
  if (__ptr != (fifo_sem_t *)0x0) {
    iVar2 = open(name,0x800);
    __ptr->sem_fd[0] = iVar2;
    iVar2 = open(name,0x801);
    __ptr->sem_fd[1] = iVar2;
    if (((-1 < __ptr->sem_fd[0]) && (-1 < __ptr->sem_fd[1])) &&
       (local_60 = fcntl(__ptr->sem_fd[0],3), -1 < (int)local_60)) {
      local_60 = local_60 & 0xfffff7ff;
      iVar2 = fcntl(__ptr->sem_fd[0],4,(ulong)local_60);
      if (-1 < iVar2) {
        if ((sem._4_4_ & 0x40) != 0) {
          for (flags = 0; (uint)flags < (uint)i; flags = flags + 1) {
            sVar4 = write(__ptr->sem_fd[1],(void *)((long)&save_errno + 3),1);
            if (sVar4 != 1) goto LAB_0010145a;
          }
        }
        __ptr->sem_magic = -0x7698badd;
        return __ptr;
      }
    }
LAB_0010145a:
    piVar3 = __errno_location();
    local_5c = *piVar3;
    if ((sem._4_4_ & 0x40) != 0) {
      unlink(name);
    }
    close(__ptr->sem_fd[0]);
    close(__ptr->sem_fd[1]);
    free(__ptr);
    iVar2 = local_5c;
    piVar3 = __errno_location();
    *piVar3 = iVar2;
  }
  return (fifo_sem_t *)0xffffffffffffffff;
}

Assistant:

fifo_sem_t *fifo_sem_open(const char* name, int oflag, ...) {
  fifo_sem_t *sem;
  va_list ap;
  mode_t mode;
  unsigned int value;
  char c;
  int i, save_errno,flags;

  if (oflag & O_CREAT) {
    va_start(ap, oflag);
    mode = va_arg(ap, mode_t);
    value = va_arg(ap, unsigned int);
    va_end(ap);
    if (mkfifo(name, mode) < 0) {
      if (errno == EEXIST && (oflag & O_EXCL) == 0) {
        oflag &= ~O_CREAT;
      } else {
        return FIFO_SEM_FAILED;
      }
    }
  }

  sem = (fifo_sem_t*)malloc(sizeof(fifo_sem_t));
  if (sem == NULL) {
    return FIFO_SEM_FAILED;
  }

  //NONBLOCK to avoid blocking here
  sem->sem_fd[0] = open(name, O_RDONLY | O_NONBLOCK);
  sem->sem_fd[1] = open(name, O_WRONLY | O_NONBLOCK);

  if (sem->sem_fd[0] < 0 || sem->sem_fd[1] < 0) {
    goto fifo_sem_open_error;
  }

  // reset NONBLOCK flag
  flags = fcntl(sem->sem_fd[0], F_GETFL);
  if (flags < 0) {
    goto fifo_sem_open_error;
  }

  flags &= ~O_NONBLOCK;

  if (fcntl(sem->sem_fd[0], F_SETFL, flags) < 0) {
    goto fifo_sem_open_error;
  }

  if (oflag & O_CREAT) {
    for (i = 0; i < value; ++i) {
      if (write(sem->sem_fd[1], &c, 1) != 1) {
        goto fifo_sem_open_error;
      }
    }
  }

  sem->sem_magic = FIFO_SEM_MAGIC;
  return sem;

fifo_sem_open_error:
  save_errno = errno;
  if (oflag & O_CREAT) {
    unlink(name);
  }
  close(sem->sem_fd[0]);
  close(sem->sem_fd[1]);
  free(sem);
  errno = save_errno;
  return FIFO_SEM_FAILED;
}